

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlancedBinaryTree.c
# Opt level: O0

int SearchBBT(BiTree T,int key,BiTree m,BiTree *p)

{
  BiTree *p_local;
  BiTree m_local;
  int key_local;
  BiTree T_local;
  
  if (T == (BiTree)0x0) {
    *p = m;
    T_local._4_4_ = 0;
  }
  else if (key == T->data) {
    *p = T;
    T_local._4_4_ = 1;
  }
  else if (key < T->data) {
    T_local._4_4_ = SearchBBT(T->lchild,key,T,p);
  }
  else {
    T_local._4_4_ = SearchBBT(T->rchlid,key,T,p);
  }
  return T_local._4_4_;
}

Assistant:

int SearchBBT(BiTree T,int key,BiTree m,BiTree *p){
    if(!T){             //查找失败
        *p = m;
        return 0;
    }
    else if (key == T->data){   //找到key
        *p = T;
        return 1;
    }
    else if(key < T->data){
        return SearchBBT(T->lchild,key,T,p);
    }
    else {
        return SearchBBT(T->rchlid,key,T,p);
    }
}